

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
::reserve(vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
          *this,size_t n)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    pvVar1 = pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
             ::allocate_object<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
                       ((polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
                         *)this,n);
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < this->nStored; uVar3 = uVar3 + 1) {
      vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(pvVar1->alloc).memoryResource + lVar2),
                 (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(this->ptr->alloc).memoryResource + lVar2));
      vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(this->ptr->alloc).memoryResource + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>::
    deallocate_object<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>> *
               )this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pvVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }